

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcPrint.c
# Opt level: O0

void Mvc_CubePrint(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  int local_1c;
  int Value;
  int iBit;
  Mvc_Cube_t *pCube_local;
  Mvc_Cover_t *pCover_local;
  
  for (local_1c = 0; local_1c < pCover->nBits; local_1c = local_1c + 1) {
    printf("%c",(ulong)(((pCube->pData[local_1c >> 5] & 1 << ((byte)local_1c & 0x1f)) != 0) + 0x30))
    ;
  }
  printf("\n");
  return;
}

Assistant:

void Mvc_CubePrint( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    int iBit, Value;
    // iterate through the literals
//    printf( "Size = %2d   ", Mvc_CubeReadSize(pCube) );
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        printf( "%c", '0' + Value );
    printf( "\n" );
}